

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

void __thiscall
mjs::global_object::validate_type
          (global_object *this,value *v,object_ptr *expected_prototype,char *expected_type)

{
  char *pcVar1;
  bool bVar2;
  value_type vVar3;
  object_ptr *poVar4;
  object *poVar5;
  object *poVar6;
  wostream *pwVar7;
  char *pcVar8;
  native_error_exception *this_00;
  wstring local_248 [32];
  wstring_view local_228;
  wstring local_218;
  wstring_view local_1f8;
  undefined1 local_1e8 [24];
  undefined1 local_1d0 [8];
  object_ptr p;
  object_ptr oval;
  wostringstream local_1a0 [8];
  wostringstream woss;
  char *expected_type_local;
  object_ptr *expected_prototype_local;
  value *v_local;
  global_object *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_1a0);
  vVar3 = value::type(v);
  if (vVar3 != object) {
    debug_print((wostream *)local_1a0,v,2,1,0);
    goto LAB_00180e1c;
  }
  poVar4 = value::object_value(v);
  gc_heap_ptr<mjs::object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::object> *)&p.super_gc_heap_ptr_untyped.pos_,poVar4);
  bVar2 = gc_heap_ptr_untyped::operator_cast_to_bool
                    ((gc_heap_ptr_untyped *)&p.super_gc_heap_ptr_untyped.pos_);
  if (!bVar2) {
    __assert_fail("oval",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                  ,0x323,
                  "void mjs::global_object::validate_type(const value &, const object_ptr &, const char *) const"
                 );
  }
  gc_heap_ptr<mjs::object>::operator->
            ((gc_heap_ptr<mjs::object> *)&p.super_gc_heap_ptr_untyped.pos_);
  mjs::object::prototype((object *)local_1d0);
  bVar2 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)local_1d0);
  if (bVar2) {
    poVar5 = gc_heap_ptr<mjs::object>::get((gc_heap_ptr<mjs::object> *)local_1d0);
    poVar6 = gc_heap_ptr<mjs::object>::get(expected_prototype);
    if (poVar5 != poVar6) goto LAB_00180d2f;
    local_1e8._20_4_ = 1;
  }
  else {
LAB_00180d2f:
    poVar4 = value::object_value(v);
    gc_heap_ptr<mjs::object>::operator->(poVar4);
    mjs::object::class_name((object *)local_1e8);
    mjs::operator<<((wostream *)local_1a0,(string *)local_1e8);
    string::~string((string *)local_1e8);
    local_1e8._20_4_ = 0;
  }
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_1d0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::object> *)&p.super_gc_heap_ptr_untyped.pos_);
  if (local_1e8._20_4_ != 0) {
    std::__cxx11::wostringstream::~wostringstream(local_1a0);
    return;
  }
LAB_00180e1c:
  pwVar7 = std::operator<<((wostream *)local_1a0," is not a");
  pcVar8 = strchr("aeiou",(int)*expected_type);
  pcVar1 = "\t";
  if (pcVar8 != (char *)0x0) {
    pcVar1 = "\\n";
  }
  pwVar7 = std::operator<<(pwVar7,pcVar1 + 1);
  pwVar7 = std::operator<<(pwVar7," ");
  std::operator<<(pwVar7,expected_type);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_218,this);
  local_1f8 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_218);
  std::__cxx11::wostringstream::str();
  local_228 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_248);
  native_error_exception::native_error_exception(this_00,type,&local_1f8,&local_228);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void global_object::validate_type(const value& v, const object_ptr& expected_prototype, const char* expected_type) const {
    std::wostringstream woss;
    if (v.type() == value_type::object) {
        auto oval = v.object_value();
        assert(oval);
        auto p = oval->prototype();
        if (p && p.get() == expected_prototype.get()) {
            return;
        }
        woss << v.object_value()->class_name();
    } else {
        mjs::debug_print(woss, v, 2, 1);
    }
    woss << " is not a" << (strchr("aeiou", expected_type[0]) ? "n" : "") << " " << expected_type;
    throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
}